

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O3

void __thiscall tf::NonblockingNotifierV2::_unpark(NonblockingNotifierV2 *this,Waiter *w)

{
  __int_type_conflict _Var1;
  pointer pWVar2;
  uint uVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  if (w != (Waiter *)0x0) {
    do {
      _Var1 = (w->next).super___atomic_base<unsigned_long>._M_i;
      pWVar2 = (this->_waiters).
               super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_40._M_device = &w->mu;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      uVar3 = w->state;
      w->state = 2;
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      if (uVar3 == 1) {
        std::condition_variable::notify_one();
      }
      uVar3 = (uint)_Var1 & 0x3fff;
    } while ((uVar3 != 0x3fff) &&
            (w = (Waiter *)
                 ((long)&(pWVar2->next).super___atomic_base<unsigned_long>._M_i +
                 (ulong)(uVar3 << 7)), pWVar2 != (pointer)0x0));
  }
  return;
}

Assistant:

void _unpark(Waiter* w) {
    for (Waiter* next; w; w = next) {
      uint64_t wnext = w->next.load(std::memory_order_relaxed) & kStackMask;
      next = (wnext == kStackMask) ? nullptr : &_waiters[static_cast<size_t>(wnext)];
#if __cplusplus >= TF_CPP20
      if(w->state.exchange(Waiter::kSignaled, std::memory_order_relaxed) == 
         Waiter::kWaiting) {
        w->state.notify_one();
      }
#else      
      unsigned state;
      {
        std::unique_lock<std::mutex> lock(w->mu);
        state = w->state;
        w->state = Waiter::kSignaled;
      }
      // Avoid notifying if it wasn't waiting.
      if (state == Waiter::kWaiting) w->cv.notify_one();
#endif
    }
  }